

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v6::internal::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  fp y;
  fp x;
  fp x_00;
  float_specs specs_00;
  float_specs specs_01;
  float_specs specs_02;
  int iVar1;
  uint64_t uVar2;
  double value_00;
  buffer<char> *buf_00;
  char *pcVar3;
  ulong uVar4;
  buffer<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  int in_EDI;
  bool bVar5;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  fp fVar6;
  fp value_01;
  fp value_02;
  double unaff_retaddr;
  int num_digits;
  fixed_handler handler_1;
  fp cached_pow_1;
  fp normalized;
  result result;
  grisu_shortest_handler handler;
  fp cached_pow;
  boundaries boundaries;
  fp fp_value;
  int cached_exp10;
  int min_exp;
  int exp;
  bool fixed;
  char digit_1;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  result result_1;
  uint64_t fractional;
  uint32_t integral;
  fp one;
  char digit_3;
  uint64_t remainder_1;
  anon_class_16_2_fdf32556 divmod_integral_1;
  uint32_t digit_2;
  result result_2;
  uint64_t fractional_1;
  uint32_t integral_1;
  fp one_1;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  buffer<char> *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  int iVar7;
  uint64_t in_stack_fffffffffffffd08;
  uint64_t in_stack_fffffffffffffd10;
  fixed_handler *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  fixed_handler *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  grisu_shortest_handler *in_stack_fffffffffffffd38;
  fp *in_stack_fffffffffffffd40;
  double in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  buffer<char> *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdbc;
  double in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uStack_22c;
  uint local_228;
  fp local_208;
  result local_1f4;
  grisu_shortest_handler local_1f0;
  significand_type local_1d8;
  int local_1d0;
  significand_type local_1c8;
  undefined8 uStack_1c0;
  significand_type local_1b8;
  undefined8 uStack_1b0;
  significand_type local_1a8;
  int local_1a0;
  significand_type local_198;
  int local_190;
  uint64_t local_188;
  int iStack_180;
  undefined4 uStack_17c;
  significand_type local_178;
  int local_170;
  internal *local_168;
  significand_type local_150;
  int local_148;
  boundaries local_140;
  fp local_130;
  int local_120;
  undefined4 local_11c;
  int local_118 [3];
  undefined1 local_10b;
  undefined1 local_10a;
  byte local_109;
  buffer<char> *local_108;
  int local_fc;
  uint uStack_ec;
  int local_e8;
  char local_e1;
  long local_e0;
  anon_class_16_2_fdf32556 local_d8;
  uint32_t local_c8;
  result local_c4;
  ulong local_c0;
  uint32_t local_b4;
  fp local_b0;
  grisu_shortest_handler *local_a0;
  int *local_98;
  long local_90;
  ulong local_88;
  int local_80;
  result local_78;
  char local_71;
  long local_70;
  anon_class_16_2_fdf32556 local_68;
  uint32_t local_58;
  result local_54;
  ulong local_50;
  uint32_t local_44;
  fp local_40;
  undefined1 *local_30;
  int *local_28;
  long local_20;
  ulong local_18;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uStack_ec = (uint)((ulong)in_RSI >> 0x20);
  local_109 = (char)((ulong)in_RSI >> 0x20) == '\x02';
  local_108 = in_RDX;
  if (0.0 < (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) {
    if ((uStack_ec >> 0x14 & 1) == 0) {
      specs_00._4_4_ = in_stack_fffffffffffffdd0;
      specs_00.precision = in_stack_fffffffffffffdcc;
      local_e8 = snprintf_float<double>
                           (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,specs_00,
                            in_stack_fffffffffffffdb0);
    }
    else {
      local_118[0] = 0;
      local_11c = 0xffffffc4;
      local_120 = 0;
      if (in_EDI < 0) {
        fp::fp(&local_130);
        if ((uStack_ec >> 0x13 & 1) == 0) {
          local_140 = fp::assign_with_boundaries<double>
                                (in_stack_fffffffffffffd40,(double)in_stack_fffffffffffffd38);
          uVar2 = local_140.upper;
        }
        else {
          local_140 = fp::assign_float_with_boundaries<double>
                                ((fp *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60)
                                 ,in_stack_fffffffffffffd58);
          uVar2 = local_140.upper;
        }
        local_168 = (internal *)local_130.f;
        value_01._8_8_ = uVar2;
        value_01.f = (ulong)(uint)local_130.e;
        fVar6 = normalize<0>((internal *)local_130.f,value_01);
        local_178 = fVar6.f;
        local_170 = fVar6.e;
        local_150 = local_178;
        local_148 = local_170;
        local_130.f = local_178;
        local_130.e = local_170;
        fVar6 = get_cached_power(in_stack_fffffffffffffd04,
                                 (int *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                                                ));
        local_1c8 = fVar6.f;
        local_190 = fVar6.e;
        uStack_1b0 = CONCAT44(local_130._12_4_,local_130.e);
        local_1b8 = local_130.f;
        uStack_1c0 = CONCAT44(uStack_17c,local_190);
        x.f._4_4_ = in_stack_fffffffffffffcfc;
        x.f._0_4_ = in_stack_fffffffffffffcf8;
        x.e = in_stack_fffffffffffffd00;
        x._12_4_ = in_stack_fffffffffffffd04;
        y.f._4_4_ = in_stack_fffffffffffffcec;
        y.f._0_4_ = in_stack_fffffffffffffce8;
        y._8_8_ = in_stack_fffffffffffffcf0;
        local_198 = local_1c8;
        local_188 = local_1c8;
        iStack_180 = local_190;
        fVar6 = operator*(x,y);
        local_1d8 = fVar6.f;
        local_1d0 = fVar6.e;
        local_1a8 = local_1d8;
        local_1a0 = local_1d0;
        local_130.f = local_1d8;
        local_130.e = local_1d0;
        uVar2 = multiply(local_140.lower,local_188);
        local_140.lower = uVar2;
        uVar2 = multiply(local_140.upper,local_188);
        local_140.lower = local_140.lower + -1;
        local_140.upper = uVar2 + 1;
        local_1f0.buf = buffer<char>::data(local_108);
        local_1f0.size = 0;
        local_1f0.diff = local_140.upper - local_130.f;
        fp::fp(&local_208,local_140.upper,local_130.e);
        local_90 = local_140.upper - local_140.lower;
        local_88 = local_208.f;
        local_80 = local_208.e;
        local_98 = local_118;
        local_a0 = &local_1f0;
        fp::fp(&local_b0,1L << (-(char)local_208.e & 0x3fU),local_208.e);
        local_b4 = (uint32_t)(local_88 >> (-(char)local_b0.e & 0x3fU));
        local_c0 = local_88 & local_b0.f - 1;
        iVar1 = grisu_count_digits(local_b4);
        *local_98 = iVar1;
        local_78 = grisu_shortest_handler::on_start
                             (local_a0,*(long *)(basic_data<void>::powers_of_10_64 +
                                                (long)(*local_98 + -1) * 8) <<
                                       (-(char)local_b0.e & 0x3fU),local_88 / 10,local_90 * 10,
                              local_98);
        if (local_78 == more) {
          do {
            local_c4 = 0;
            local_c8 = 0;
            local_d8.digit = &local_c8;
            local_d8.integral = &local_b4;
            uVar4 = (ulong)(*local_98 - 1);
            switch(uVar4) {
            case 0:
              local_c8 = local_b4;
              local_b4 = 0;
              break;
            case 1:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,10);
              break;
            case 2:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,100);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,1000);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,10000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,100000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,1000000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,10000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,100000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::internal::grisu_shortest_handler>::anon_class_16_2_fdf32556
              ::operator()(&local_d8,1000000000);
            }
            *local_98 = *local_98 + -1;
            local_e0 = ((ulong)local_b4 << (-(char)local_b0.e & 0x3fU)) + local_c0;
            in_stack_fffffffffffffce8 = 1;
            local_78 = grisu_shortest_handler::on_digit
                                 (in_stack_fffffffffffffd38,
                                  (char)((ulong)in_stack_fffffffffffffd30 >> 0x38),
                                  (uint64_t)in_stack_fffffffffffffd28,
                                  CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                  (uint64_t)in_stack_fffffffffffffd18,(int)(uVar4 >> 0x20),
                                  SUB81(uVar4 >> 0x18,0));
            if (local_78 != more) goto LAB_001efc0e;
          } while (0 < *local_98);
          do {
            local_c4 = 0;
            local_90 = local_90 * 10;
            local_e1 = (char)(local_c0 * 10 >> (-(char)local_b0.e & 0x3fU)) + '0';
            local_c0 = local_b0.f - 1 & local_c0 * 10;
            *local_98 = *local_98 + -1;
            in_stack_fffffffffffffce8 = 0;
            local_78 = grisu_shortest_handler::on_digit
                                 (in_stack_fffffffffffffd38,
                                  (char)((ulong)in_stack_fffffffffffffd30 >> 0x38),
                                  (uint64_t)in_stack_fffffffffffffd28,
                                  CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                  (uint64_t)in_stack_fffffffffffffd18,(int)(uVar4 >> 0x20),
                                  SUB81(uVar4 >> 0x18,0));
          } while (local_78 == more);
        }
LAB_001efc0e:
        local_1f4 = local_78;
        local_c4 = local_78;
        if (local_78 == error) {
          local_118[0] = (local_1f0.size - local_120) + -1 + local_118[0];
          fallback_format<double>
                    (unaff_retaddr,
                     (buffer<char> *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (int *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
          return local_118[0];
        }
        to_unsigned<int>(local_1f0.size);
        buffer<char>::resize
                  (in_stack_fffffffffffffcf0,
                   CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      }
      else {
        if (0x11 < in_EDI) {
          specs_01._4_4_ = in_stack_fffffffffffffdd0;
          specs_01.precision = in_stack_fffffffffffffdcc;
          iVar1 = snprintf_float<double>
                            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,specs_01,
                             in_stack_fffffffffffffdb0);
          return iVar1;
        }
        fp::fp<double>((fp *)in_stack_fffffffffffffcf0,
                       (double)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        value_02.f = (ulong)local_228;
        value_02._8_8_ = extraout_RDX;
        fVar6 = normalize<0>((internal *)CONCAT44(uStack_22c,in_stack_fffffffffffffdd0),value_02);
        value_00 = (double)fVar6.f;
        fVar6 = get_cached_power(in_stack_fffffffffffffd04,
                                 (int *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8
                                                ));
        buf_00 = (buffer<char> *)fVar6.f;
        x_00.f._4_4_ = in_stack_fffffffffffffcfc;
        x_00.f._0_4_ = in_stack_fffffffffffffcf8;
        x_00.e = in_stack_fffffffffffffd00;
        x_00._12_4_ = in_stack_fffffffffffffd04;
        fVar6.f._4_4_ = in_stack_fffffffffffffcec;
        fVar6.f._0_4_ = in_stack_fffffffffffffce8;
        fVar6._8_8_ = in_stack_fffffffffffffcf0;
        fVar6 = operator*(x_00,fVar6);
        buffer<char>::data(local_108);
        local_20 = 1;
        local_28 = local_118;
        local_30 = &stack0xfffffffffffffd40;
        local_18 = fVar6.f;
        fp::fp(&local_40,1L << (-(char)fVar6.e & 0x3fU),fVar6.e);
        local_44 = (uint32_t)(local_18 >> (-(char)local_40.e & 0x3fU));
        local_50 = local_18 & local_40.f - 1;
        iVar1 = grisu_count_digits(local_44);
        *local_28 = iVar1;
        local_54 = fixed_handler::on_start
                             (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                              in_stack_fffffffffffffd08,
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (int *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        if (local_54 == more) {
          do {
            local_54 = 0;
            local_58 = 0;
            local_68.digit = &local_58;
            local_68.integral = &local_44;
            iVar1 = *local_28 + -1;
            iVar7 = 0;
            switch(iVar1) {
            case 0:
              local_58 = local_44;
              local_44 = 0;
              break;
            case 1:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,10);
              break;
            case 2:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,100);
              break;
            case 3:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,1000);
              break;
            case 4:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,10000);
              break;
            case 5:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,100000);
              break;
            case 6:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,1000000);
              break;
            case 7:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,10000000);
              break;
            case 8:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,100000000);
              break;
            case 9:
              grisu_gen_digits<fmt::v6::internal::fixed_handler>::anon_class_16_2_fdf32556::
              operator()(&local_68,1000000000);
            }
            *local_28 = *local_28 + -1;
            local_70 = ((ulong)local_44 << (-(char)local_40.e & 0x3fU)) + local_50;
            in_stack_fffffffffffffce8 = 1;
            local_54 = fixed_handler::on_digit
                                 (in_stack_fffffffffffffd28,
                                  (char)((uint)in_stack_fffffffffffffd24 >> 0x18),
                                  (uint64_t)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                                  in_stack_fffffffffffffd08,iVar7,SUB41((uint)iVar1 >> 0x18,0));
            if (local_54 != more) goto LAB_001f0286;
          } while (0 < *local_28);
          do {
            local_54 = 0;
            local_20 = local_20 * 10;
            local_71 = (char)(local_50 * 10 >> (-(char)local_40.e & 0x3fU)) + '0';
            local_50 = local_40.f - 1 & local_50 * 10;
            *local_28 = *local_28 + -1;
            in_stack_fffffffffffffce8 = 0;
            local_54 = fixed_handler::on_digit
                                 (in_stack_fffffffffffffd28,
                                  (char)((uint)in_stack_fffffffffffffd24 >> 0x18),
                                  (uint64_t)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                                  in_stack_fffffffffffffd08,iVar7,SUB41((uint)iVar1 >> 0x18,0));
          } while (local_54 == more);
        }
LAB_001f0286:
        if (local_54 == error) {
          specs_02._4_4_ = in_stack_fffffffffffffdd0;
          specs_02.precision = in_stack_fffffffffffffdcc;
          iVar1 = snprintf_float<double>(value_00,in_stack_fffffffffffffdbc,specs_02,buf_00);
          return iVar1;
        }
        iVar1 = 0;
        if ((local_109 & 1) == 0) {
          while( true ) {
            bVar5 = false;
            if (0 < iVar1) {
              pcVar3 = buffer<char>::operator[]<int>(local_108,iVar1 + -1);
              bVar5 = *pcVar3 == '0';
            }
            if (!bVar5) break;
            iVar1 = iVar1 + -1;
            local_118[0] = local_118[0] + 1;
          }
        }
        to_unsigned<int>(iVar1);
        buffer<char>::resize
                  (local_108,CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      }
      local_e8 = local_118[0] - local_120;
    }
  }
  else if ((in_EDI < 1) || (!(bool)local_109)) {
    local_10a = 0x30;
    buffer<char>::push_back
              (in_stack_fffffffffffffcf0,
               (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    local_e8 = 0;
  }
  else {
    local_fc = in_EDI;
    to_unsigned<int>(in_EDI);
    buffer<char>::resize
              (in_stack_fffffffffffffcf0,
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    buffer<char>::data(local_108);
    local_10b = 0x30;
    std::uninitialized_fill_n<char*,int,char>
              ((char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcfc,(char *)in_stack_fffffffffffffcf0);
    local_e8 = -local_fc;
  }
  return local_e8;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}